

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetConfigAttribSimpleCase::checkAttribute
          (GetConfigAttribSimpleCase *this,EGLenum attrib,EGLint value)

{
  EGLint value_local;
  EGLenum attrib_local;
  GetConfigAttribSimpleCase *this_local;
  
  switch(attrib) {
  case 0x3027:
    checkCaveat(this,value);
    break;
  default:
    checkInteger(this,attrib,value);
    break;
  case 0x302d:
  case 0x3039:
  case 0x303a:
    checkBoolean(this,attrib,value);
    break;
  case 0x3033:
    checkSurfaceTypeMask(this,value);
    break;
  case 0x3034:
    checkTransparentType(this,value);
    break;
  case 0x303f:
    checkColorBufferType(this,value);
    break;
  case 0x3040:
  case 0x3042:
  }
  return;
}

Assistant:

void checkAttribute (EGLenum attrib, EGLint value)
	{
		switch (attrib)
		{
			case EGL_COLOR_BUFFER_TYPE:
				checkColorBufferType(value);
				break;
			case EGL_CONFIG_CAVEAT:
				checkCaveat(value);
				break;
			case EGL_TRANSPARENT_TYPE:
				checkTransparentType(value);
				break;
			case EGL_CONFORMANT:
			case EGL_RENDERABLE_TYPE:
				// Just print what we know
				break;
			case EGL_SURFACE_TYPE:
				checkSurfaceTypeMask(value);
				break;
			case EGL_BIND_TO_TEXTURE_RGB:
			case EGL_BIND_TO_TEXTURE_RGBA:
			case EGL_NATIVE_RENDERABLE:
				checkBoolean(attrib, value);
				break;
			default:
				checkInteger(attrib, value);
		}
	}